

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cc
# Opt level: O0

void __thiscall Tester::compileFile(Tester *this,string *filename,Report *report)

{
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<flow::lang::Feature> __l_00;
  Report *pRVar1;
  element_type *program_00;
  pointer this_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RCX;
  string_view format_str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_7f0;
  TargetCodeGenerator local_7a0;
  undefined1 local_4e8 [8];
  unique_ptr<flow::Program,_std::default_delete<flow::Program>_> program;
  allocator<char> local_4b1;
  string local_4b0;
  _func_bool_IRHandler_ptr *local_490;
  HandlerPass local_488;
  allocator<char> local_461;
  string local_460;
  _func_bool_IRHandler_ptr *local_440;
  HandlerPass local_438;
  allocator<char> local_411;
  string local_410;
  _func_bool_IRHandler_ptr *local_3f0;
  HandlerPass local_3e8;
  allocator<char> local_3c1;
  string local_3c0;
  _func_bool_IRHandler_ptr *local_3a0;
  HandlerPass local_398;
  allocator<char> local_371;
  string local_370;
  _func_bool_IRHandler_ptr *local_350;
  HandlerPass local_348;
  allocator<char> local_321;
  string local_320;
  _func_bool_IRHandler_ptr *local_300;
  HandlerPass local_2f8;
  allocator<char> local_2d1;
  string local_2d0;
  undefined1 local_2b0 [8];
  PassManager pm;
  undefined1 local_290 [8];
  shared_ptr<flow::IRProgram> programIR;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_270;
  iterator local_250;
  pointer local_248;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_240;
  undefined1 local_228 [8];
  IRGenerator irgen;
  unique_ptr<flow::lang::UnitSym,_std::default_delete<flow::lang::UnitSym>_> unit;
  unique_ptr<std::basic_istream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>_>
  local_138;
  undefined1 local_130 [62];
  allocator<flow::lang::Feature> local_f2;
  less<flow::lang::Feature> local_f1;
  Feature local_f0 [2];
  iterator local_e8;
  size_type local_e0;
  set<flow::lang::Feature,_std::less<flow::lang::Feature>,_std::allocator<flow::lang::Feature>_>
  local_d8;
  undefined1 local_a8 [8];
  Parser parser;
  undefined1 auStack_30 [7];
  bool optimize;
  char *local_28;
  Report *local_20;
  Report *report_local;
  string *filename_local;
  Tester *this_local;
  
  local_20 = report;
  report_local = (Report *)filename;
  filename_local = (string *)this;
  fmt::v5::basic_string_view<char>::basic_string_view
            ((basic_string_view<char> *)auStack_30,"testing {}\n");
  format_str.size_ = (size_t)report_local;
  format_str.data_ = local_28;
  fmt::v5::print<std::__cxx11::string>(_auStack_30,format_str,in_RCX);
  parser.report_._7_1_ = 1;
  local_f0[0] = GlobalScope;
  local_f0[1] = 2;
  local_e8 = local_f0;
  local_e0 = 2;
  std::allocator<flow::lang::Feature>::allocator(&local_f2);
  __l_00._M_len = local_e0;
  __l_00._M_array = local_e8;
  std::
  set<flow::lang::Feature,_std::less<flow::lang::Feature>,_std::allocator<flow::lang::Feature>_>::
  set(&local_d8,__l_00,&local_f1,&local_f2);
  pRVar1 = local_20;
  local_130._0_8_ = this;
  std::
  function<bool(std::__cxx11::string_const&,std::__cxx11::string_const&,std::vector<flow::NativeCallback*,std::allocator<flow::NativeCallback*>>*)>
  ::function<Tester::compileFile(std::__cxx11::string_const&,flow::diagnostics::Report*)::__0,void>
            ((function<bool(std::__cxx11::string_const&,std::__cxx11::string_const&,std::vector<flow::NativeCallback*,std::allocator<flow::NativeCallback*>>*)>
              *)(local_130 + 8),(anon_class_8_1_8991fb9c *)local_130);
  flow::lang::Parser::Parser
            ((Parser *)local_a8,&local_d8,pRVar1,&this->super_Runtime,
             (ImportHandler *)(local_130 + 8));
  std::
  function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::vector<flow::NativeCallback_*,_std::allocator<flow::NativeCallback_*>_>_*)>
  ::~function((function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::vector<flow::NativeCallback_*,_std::allocator<flow::NativeCallback_*>_>_*)>
               *)(local_130 + 8));
  std::
  set<flow::lang::Feature,_std::less<flow::lang::Feature>,_std::allocator<flow::lang::Feature>_>::
  ~set(&local_d8);
  std::allocator<flow::lang::Feature>::~allocator(&local_f2);
  std::make_unique<std::ifstream,std::__cxx11::string_const&>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&unit);
  std::unique_ptr<std::istream,std::default_delete<std::istream>>::
  unique_ptr<std::ifstream,std::default_delete<std::ifstream>,void>
            ((unique_ptr<std::istream,std::default_delete<std::istream>> *)&local_138,
             (unique_ptr<std::basic_ifstream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
              *)&unit);
  flow::lang::Parser::openStream((Parser *)local_a8,&local_138,(string *)report_local);
  std::
  unique_ptr<std::basic_istream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>_>
  ::~unique_ptr(&local_138);
  std::
  unique_ptr<std::basic_ifstream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::basic_ifstream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
                 *)&unit);
  flow::lang::Parser::parse((Parser *)&irgen.report_);
  pRVar1 = local_20;
  programIR.super___shared_ptr<flow::IRProgram,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._6_1_
       = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_270,"main",
             (allocator<char> *)
             ((long)&programIR.super___shared_ptr<flow::IRProgram,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  programIR.super___shared_ptr<flow::IRProgram,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._6_1_
       = 0;
  local_250 = &local_270;
  local_248 = (pointer)0x1;
  this_00 = (allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)((long)&programIR.super___shared_ptr<flow::IRProgram,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi + 5);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(this_00);
  __l._M_len = (size_type)local_248;
  __l._M_array = local_250;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_240,__l,this_00);
  flow::lang::IRGenerator::IRGenerator((IRGenerator *)local_228,pRVar1,&local_240);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_240);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)((long)&programIR.super___shared_ptr<flow::IRProgram,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi + 5));
  local_7f0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_250;
  do {
    local_7f0 = local_7f0 + -1;
    std::__cxx11::string::~string((string *)local_7f0);
  } while (local_7f0 != &local_270);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&programIR.super___shared_ptr<flow::IRProgram,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  std::unique_ptr<flow::lang::UnitSym,_std::default_delete<flow::lang::UnitSym>_>::get
            ((unique_ptr<flow::lang::UnitSym,_std::default_delete<flow::lang::UnitSym>_> *)
             &irgen.report_);
  flow::lang::IRGenerator::generate
            ((IRGenerator *)
             &pm.handlerPasses_.
              super__List_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_(flow::IRHandler_*)>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_(flow::IRHandler_*)>_>_>_>
              ._M_impl._M_node._M_size,(UnitSym *)local_228);
  std::shared_ptr<flow::IRProgram>::
  shared_ptr<flow::IRProgram,std::default_delete<flow::IRProgram>,void>
            ((shared_ptr<flow::IRProgram> *)local_290,
             (unique_ptr<flow::IRProgram,_std::default_delete<flow::IRProgram>_> *)
             &pm.handlerPasses_.
              super__List_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_(flow::IRHandler_*)>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_(flow::IRHandler_*)>_>_>_>
              ._M_impl._M_node._M_size);
  std::unique_ptr<flow::IRProgram,_std::default_delete<flow::IRProgram>_>::~unique_ptr
            ((unique_ptr<flow::IRProgram,_std::default_delete<flow::IRProgram>_> *)
             &pm.handlerPasses_.
              super__List_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_(flow::IRHandler_*)>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_(flow::IRHandler_*)>_>_>_>
              ._M_impl._M_node._M_size);
  flow::PassManager::PassManager((PassManager *)local_2b0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2d0,"eliminate-empty-blocks",&local_2d1);
  local_300 = flow::transform::emptyBlockElimination;
  std::function<bool(flow::IRHandler*)>::function<bool(*)(flow::IRHandler*),void>
            ((function<bool(flow::IRHandler*)> *)&local_2f8,&local_300);
  flow::PassManager::registerPass((PassManager *)local_2b0,&local_2d0,&local_2f8);
  std::function<bool_(flow::IRHandler_*)>::~function(&local_2f8);
  std::__cxx11::string::~string((string *)&local_2d0);
  std::allocator<char>::~allocator(&local_2d1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_320,"eliminate-linear-br",&local_321);
  local_350 = flow::transform::eliminateLinearBr;
  std::function<bool(flow::IRHandler*)>::function<bool(*)(flow::IRHandler*),void>
            ((function<bool(flow::IRHandler*)> *)&local_348,&local_350);
  flow::PassManager::registerPass((PassManager *)local_2b0,&local_320,&local_348);
  std::function<bool_(flow::IRHandler_*)>::~function(&local_348);
  std::__cxx11::string::~string((string *)&local_320);
  std::allocator<char>::~allocator(&local_321);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_370,"eliminate-unused-blocks",&local_371);
  local_3a0 = flow::transform::eliminateUnusedBlocks;
  std::function<bool(flow::IRHandler*)>::function<bool(*)(flow::IRHandler*),void>
            ((function<bool(flow::IRHandler*)> *)&local_398,&local_3a0);
  flow::PassManager::registerPass((PassManager *)local_2b0,&local_370,&local_398);
  std::function<bool_(flow::IRHandler_*)>::~function(&local_398);
  std::__cxx11::string::~string((string *)&local_370);
  std::allocator<char>::~allocator(&local_371);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3c0,"eliminate-unused-instr",&local_3c1);
  local_3f0 = flow::transform::eliminateUnusedInstr;
  std::function<bool(flow::IRHandler*)>::function<bool(*)(flow::IRHandler*),void>
            ((function<bool(flow::IRHandler*)> *)&local_3e8,&local_3f0);
  flow::PassManager::registerPass((PassManager *)local_2b0,&local_3c0,&local_3e8);
  std::function<bool_(flow::IRHandler_*)>::~function(&local_3e8);
  std::__cxx11::string::~string((string *)&local_3c0);
  std::allocator<char>::~allocator(&local_3c1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_410,"fold-constant-condbr",&local_411);
  local_440 = flow::transform::foldConstantCondBr;
  std::function<bool(flow::IRHandler*)>::function<bool(*)(flow::IRHandler*),void>
            ((function<bool(flow::IRHandler*)> *)&local_438,&local_440);
  flow::PassManager::registerPass((PassManager *)local_2b0,&local_410,&local_438);
  std::function<bool_(flow::IRHandler_*)>::~function(&local_438);
  std::__cxx11::string::~string((string *)&local_410);
  std::allocator<char>::~allocator(&local_411);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_460,"rewrite-br-to-exit",&local_461);
  local_490 = flow::transform::rewriteBrToExit;
  std::function<bool(flow::IRHandler*)>::function<bool(*)(flow::IRHandler*),void>
            ((function<bool(flow::IRHandler*)> *)&local_488,&local_490);
  flow::PassManager::registerPass((PassManager *)local_2b0,&local_460,&local_488);
  std::function<bool_(flow::IRHandler_*)>::~function(&local_488);
  std::__cxx11::string::~string((string *)&local_460);
  std::allocator<char>::~allocator(&local_461);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_4b0,"rewrite-cond-br-to-same-branches",&local_4b1);
  program._M_t.super___uniq_ptr_impl<flow::Program,_std::default_delete<flow::Program>_>._M_t.
  super__Tuple_impl<0UL,_flow::Program_*,_std::default_delete<flow::Program>_>.
  super__Head_base<0UL,_flow::Program_*,_false>._M_head_impl =
       (__uniq_ptr_data<flow::Program,_std::default_delete<flow::Program>,_true,_true>)
       flow::transform::rewriteCondBrToSameBranches;
  std::function<bool(flow::IRHandler*)>::function<bool(*)(flow::IRHandler*),void>
            ((function<bool(flow::IRHandler*)> *)&stack0xfffffffffffffb28,
             (_func_bool_IRHandler_ptr **)&program);
  flow::PassManager::registerPass
            ((PassManager *)local_2b0,&local_4b0,(HandlerPass *)&stack0xfffffffffffffb28);
  std::function<bool_(flow::IRHandler_*)>::~function
            ((function<bool_(flow::IRHandler_*)> *)&stack0xfffffffffffffb28);
  std::__cxx11::string::~string((string *)&local_4b0);
  std::allocator<char>::~allocator(&local_4b1);
  program_00 = std::__shared_ptr<flow::IRProgram,_(__gnu_cxx::_Lock_policy)2>::get
                         ((__shared_ptr<flow::IRProgram,_(__gnu_cxx::_Lock_policy)2> *)local_290);
  flow::PassManager::run((PassManager *)local_2b0,program_00);
  flow::PassManager::~PassManager((PassManager *)local_2b0);
  flow::TargetCodeGenerator::TargetCodeGenerator(&local_7a0);
  std::__shared_ptr<flow::IRProgram,_(__gnu_cxx::_Lock_policy)2>::get
            ((__shared_ptr<flow::IRProgram,_(__gnu_cxx::_Lock_policy)2> *)local_290);
  flow::TargetCodeGenerator::generate((TargetCodeGenerator *)local_4e8,(IRProgram *)&local_7a0);
  flow::TargetCodeGenerator::~TargetCodeGenerator(&local_7a0);
  this_01 = std::unique_ptr<flow::Program,_std::default_delete<flow::Program>_>::operator->
                      ((unique_ptr<flow::Program,_std::default_delete<flow::Program>_> *)local_4e8);
  flow::Program::link(this_01,(char *)this,(char *)local_20);
  std::__cxx11::string::clear();
  std::unique_ptr<flow::Program,_std::default_delete<flow::Program>_>::~unique_ptr
            ((unique_ptr<flow::Program,_std::default_delete<flow::Program>_> *)local_4e8);
  std::shared_ptr<flow::IRProgram>::~shared_ptr((shared_ptr<flow::IRProgram> *)local_290);
  flow::lang::IRGenerator::~IRGenerator((IRGenerator *)local_228);
  std::unique_ptr<flow::lang::UnitSym,_std::default_delete<flow::lang::UnitSym>_>::~unique_ptr
            ((unique_ptr<flow::lang::UnitSym,_std::default_delete<flow::lang::UnitSym>_> *)
             &irgen.report_);
  flow::lang::Parser::~Parser((Parser *)local_a8);
  return;
}

Assistant:

void Tester::compileFile(const std::string& filename, flow::diagnostics::Report* report) {
  fmt::print("testing {}\n", filename);

  constexpr bool optimize = true;
  flow::lang::Parser parser{{flow::lang::Feature::GlobalScope, flow::lang::Feature::WhileLoop},
                            report,
                            this,
                            [this](auto x, auto y, auto z) { return import(x, y, z); }};
  parser.openStream(std::make_unique<std::ifstream>(filename), filename);
  std::unique_ptr<flow::lang::UnitSym> unit = parser.parse();

  flow::lang::IRGenerator irgen(report, {"main"});
  std::shared_ptr<flow::IRProgram> programIR = irgen.generate(unit.get());

  if (optimize) {
    flow::PassManager pm;

    pm.registerPass("eliminate-empty-blocks", &flow::transform::emptyBlockElimination);
    pm.registerPass("eliminate-linear-br", &flow::transform::eliminateLinearBr);
    pm.registerPass("eliminate-unused-blocks", &flow::transform::eliminateUnusedBlocks);
    pm.registerPass("eliminate-unused-instr", &flow::transform::eliminateUnusedInstr);
    pm.registerPass("fold-constant-condbr", &flow::transform::foldConstantCondBr);
    pm.registerPass("rewrite-br-to-exit", &flow::transform::rewriteBrToExit);
    pm.registerPass("rewrite-cond-br-to-same-branches", &flow::transform::rewriteCondBrToSameBranches);

    pm.run(programIR.get());
  }

  std::unique_ptr<flow::Program> program = flow::TargetCodeGenerator().generate(programIR.get());

  program->link(this, report);

  // TODO: execute to check expected output against `output_`
  output_.clear();
}